

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_solver.c
# Opt level: O1

termination_code PDHG_Check_Infeasibility(CUPDLPwork *pdhg,int bool_print)

{
  CUPDLPresobj *pCVar1;
  termination_code tVar2;
  double dVar3;
  
  pCVar1 = pdhg->resobj;
  tVar2 = FEASIBLE;
  if ((0.0 < pCVar1->dPrimalInfeasObj) &&
     (dVar3 = pCVar1->dPrimalInfeasObj * pCVar1->dFeasTol,
     pCVar1->dPrimalInfeasRes <= dVar3 && dVar3 != pCVar1->dPrimalInfeasRes)) {
    pCVar1->primalCode = INFEASIBLE;
    pCVar1->termInfeasIterate = LAST_ITERATE;
    tVar2 = INFEASIBLE_OR_UNBOUNDED;
  }
  if ((pCVar1->dDualInfeasObj < 0.0) &&
     (dVar3 = pCVar1->dDualInfeasObj * -pCVar1->dFeasTol,
     pCVar1->dDualInfeasRes <= dVar3 && dVar3 != pCVar1->dDualInfeasRes)) {
    pCVar1->dualCode = INFEASIBLE;
    pCVar1->termInfeasIterate = LAST_ITERATE;
    tVar2 = INFEASIBLE_OR_UNBOUNDED;
  }
  if ((0.0 < pCVar1->dPrimalInfeasObjAverage) &&
     (dVar3 = pCVar1->dPrimalInfeasObjAverage * pCVar1->dFeasTol,
     pCVar1->dPrimalInfeasResAverage <= dVar3 && dVar3 != pCVar1->dPrimalInfeasResAverage)) {
    pCVar1->primalCode = INFEASIBLE;
    pCVar1->termInfeasIterate = AVERAGE_ITERATE;
    tVar2 = INFEASIBLE_OR_UNBOUNDED;
  }
  if ((pCVar1->dDualInfeasObjAverage < 0.0) &&
     (dVar3 = pCVar1->dDualInfeasObjAverage * -pCVar1->dFeasTol,
     pCVar1->dDualInfeasResAverage <= dVar3 && dVar3 != pCVar1->dDualInfeasResAverage)) {
    pCVar1->dualCode = INFEASIBLE;
    pCVar1->termInfeasIterate = AVERAGE_ITERATE;
    tVar2 = INFEASIBLE_OR_UNBOUNDED;
  }
  if (bool_print != 0) {
    puts("Last iter:");
    printf("  Primal obj = %+.4e, res = %+.4e\n",pCVar1->dPrimalInfeasObj,pCVar1->dPrimalInfeasRes);
    printf("  Dual   obj = %+.4e, res = %+.4e\n",pCVar1->dDualInfeasObj,pCVar1->dDualInfeasRes);
    puts("Average iter:");
    printf("  Primal obj = %+.4e, res = %+.4e\n",pCVar1->dPrimalInfeasObjAverage,
           pCVar1->dPrimalInfeasResAverage);
    printf("  Dual   obj = %+.4e, res = %+.4e\n",pCVar1->dDualInfeasObjAverage,
           pCVar1->dDualInfeasResAverage);
  }
  return tVar2;
}

Assistant:

termination_code PDHG_Check_Infeasibility(CUPDLPwork *pdhg, int bool_print) {
  CUPDLPresobj *resobj = pdhg->resobj;
  termination_code t_code = FEASIBLE;

  // current solution

  // primal infeasibility
  if (PDHG_Check_Primal_Infeasibility(pdhg, resobj->dPrimalInfeasObj,
                                      resobj->dPrimalInfeasRes) == INFEASIBLE) {
    resobj->primalCode = INFEASIBLE;
    resobj->termInfeasIterate = LAST_ITERATE;
    t_code = INFEASIBLE_OR_UNBOUNDED;
  }

  // dual infeasibility
  if (PDHG_Check_Dual_Infeasibility(pdhg, resobj->dDualInfeasObj,
                                    resobj->dDualInfeasRes) == INFEASIBLE) {
    resobj->dualCode = INFEASIBLE;
    resobj->termInfeasIterate = LAST_ITERATE;
    t_code = INFEASIBLE_OR_UNBOUNDED;
  }

  // average solution
  // primal infeasibility
  if (PDHG_Check_Primal_Infeasibility(pdhg, resobj->dPrimalInfeasObjAverage,
                                      resobj->dPrimalInfeasResAverage) ==
      INFEASIBLE) {
    resobj->primalCode = INFEASIBLE;
    resobj->termInfeasIterate = AVERAGE_ITERATE;
    t_code = INFEASIBLE_OR_UNBOUNDED;
  }

  // dual infeasibility
  if (PDHG_Check_Dual_Infeasibility(pdhg, resobj->dDualInfeasObjAverage,
                                    resobj->dDualInfeasResAverage) ==
      INFEASIBLE) {
    resobj->dualCode = INFEASIBLE;
    resobj->termInfeasIterate = AVERAGE_ITERATE;
    t_code = INFEASIBLE_OR_UNBOUNDED;
  }

  if (bool_print) {
    printf("Last iter:\n");
    printf("  Primal obj = %+.4e, res = %+.4e\n", resobj->dPrimalInfeasObj,
           resobj->dPrimalInfeasRes);
    printf("  Dual   obj = %+.4e, res = %+.4e\n", resobj->dDualInfeasObj,
           resobj->dDualInfeasRes);
    printf("Average iter:\n");
    printf("  Primal obj = %+.4e, res = %+.4e\n",
           resobj->dPrimalInfeasObjAverage, resobj->dPrimalInfeasResAverage);
    printf("  Dual   obj = %+.4e, res = %+.4e\n", resobj->dDualInfeasObjAverage,
           resobj->dDualInfeasResAverage);
  }

  return t_code;
}